

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.h
# Opt level: O2

int __thiscall OS_CoreSocket::get_peer_addr(OS_CoreSocket *this,char **ip,int *port)

{
  int iVar1;
  socklen_t len;
  sockaddr_storage addr;
  socklen_t local_ac;
  sockaddr_storage local_a8;
  
  local_ac = 0x80;
  getpeername(this->s,(sockaddr *)&local_a8,&local_ac);
  iVar1 = parse_addr(this,&local_a8,local_ac,ip,port);
  return iVar1;
}

Assistant:

int get_peer_addr(char *&ip, int &port)
    {
        socklen_t len;
        struct sockaddr_storage addr;

        /* get the peer name */
        len = sizeof(addr);
        getpeername(s, (struct sockaddr *)&addr, &len);

        /* parse the address */
        return parse_addr(addr, len, ip, port);
    }